

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O2

psa_status_t psa_get_empty_key_slot(psa_key_handle_t *handle,psa_key_slot_t **p_slot)

{
  psa_status_t pVar1;
  psa_key_slot_t *ppVar2;
  ushort uVar3;
  uint uVar4;
  
  pVar1 = -0x89;
  if ((global_data._1536_1_ & 1) != 0) {
    ppVar2 = (psa_key_slot_t *)0x0;
    uVar3 = 0x20;
    do {
      *handle = uVar3;
      if (uVar3 == 0) {
        pVar1 = -0x8d;
        goto LAB_0011480d;
      }
      uVar4 = (uint)uVar3;
      uVar3 = uVar3 - 1;
    } while (global_data.key_slots[uVar4 - 1].attr.type != 0);
    ppVar2 = global_data.key_slots + (uVar4 - 1);
    pVar1 = 0;
LAB_0011480d:
    *p_slot = ppVar2;
  }
  return pVar1;
}

Assistant:

psa_status_t psa_get_empty_key_slot( psa_key_handle_t *handle,
                                             psa_key_slot_t **p_slot )
{
    if( ! global_data.key_slots_initialized )
        return( PSA_ERROR_BAD_STATE );

    for( *handle = PSA_KEY_SLOT_COUNT; *handle != 0; --( *handle ) )
    {
        *p_slot = &global_data.key_slots[*handle - 1];
        if( ! psa_is_key_slot_occupied( *p_slot ) )
            return( PSA_SUCCESS );
    }
    *p_slot = NULL;
    return( PSA_ERROR_INSUFFICIENT_MEMORY );
}